

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfPool.c
# Opt level: O0

void sbfPoolAtExit(void)

{
  sbfPoolCountImpl *psVar1;
  sbfPoolCountTreeImpl *unaff_retaddr;
  sbfPoolCount count1;
  sbfPoolCount count;
  u_int i;
  sbfPoolCountImpl *local_10;
  undefined4 in_stack_fffffffffffffff8;
  uint uVar2;
  
  for (uVar2 = 0; uVar2 < gSbfPoolAtExitListSize; uVar2 = uVar2 + 1) {
    sbfPool_destroy((sbfPool)0x10a48c);
  }
  free(gSbfPoolAtExitList);
  gSbfPoolAtExitListSize = 0;
  local_10 = sbfPoolCountTreeImpl_RB_MINMAX(&gSbfPoolCountTree,-1);
  while (local_10 != (sbfPoolCountImpl *)0x0) {
    psVar1 = sbfPoolCountTreeImpl_RB_NEXT(local_10);
    sbfPoolCountTreeImpl_RB_REMOVE
              (unaff_retaddr,(sbfPoolCountImpl *)CONCAT44(uVar2,in_stack_fffffffffffffff8));
    free(local_10);
    local_10 = psVar1;
  }
  return;
}

Assistant:

static void
sbfPoolAtExit (void)
{
    u_int        i;
    sbfPoolCount count;
    sbfPoolCount count1;

    for (i = 0; i < gSbfPoolAtExitListSize; i++)
        sbfPool_destroy (gSbfPoolAtExitList[i]);
    free (gSbfPoolAtExitList);
    gSbfPoolAtExitListSize = 0;

    RB_FOREACH_SAFE (count, sbfPoolCountTreeImpl, &gSbfPoolCountTree, count1)
    {
        RB_REMOVE (sbfPoolCountTreeImpl, &gSbfPoolCountTree, count);
        free (count);
    }
}